

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void check_config(vector_t *cfg)

{
  code *pcVar1;
  char extraout_AL;
  char extraout_AL_00;
  char extraout_AL_01;
  char extraout_AL_02;
  char extraout_AL_03;
  char extraout_AL_04;
  char extraout_AL_05;
  char extraout_AL_06;
  char extraout_AL_07;
  char extraout_AL_08;
  char extraout_AL_09;
  char extraout_AL_10;
  char extraout_AL_11;
  char extraout_AL_12;
  char extraout_AL_13;
  char extraout_AL_14;
  char extraout_AL_15;
  char extraout_AL_16;
  const_reference pvVar2;
  double __x;
  double __x_00;
  double __x_01;
  double __x_02;
  double __x_03;
  double __x_04;
  double __x_05;
  double __x_06;
  double __x_07;
  double __x_08;
  double __x_09;
  double __x_10;
  double __x_11;
  double __x_12;
  double __x_13;
  double __x_14;
  double __x_15;
  double __x_16;
  ExpressionDecomposer local_d0;
  bool local_cc [4];
  Result local_c8;
  ResultBuilder DOCTEST_RB;
  Expression_lhs<const_QString_&> local_30;
  
  doctest::detail::ResultBuilder::ResultBuilder
            (&DOCTEST_RB,DT_REQUIRE,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/igormironchik[P]cfgfile/tests/auto/QtGenerator/main.cpp"
             ,0x51,"cfg.vector().size() == 1","","");
  doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_d0,DT_REQUIRE);
  local_30.lhs = (QString *)
                 (((long)(cfg->m_vector).
                         super__Vector_base<cfg::tags_t,_std::allocator<cfg::tags_t>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                  (long)(cfg->m_vector).
                        super__Vector_base<cfg::tags_t,_std::allocator<cfg::tags_t>_>._M_impl.
                        super__Vector_impl_data._M_start) / 0xe0);
  local_30.m_at = local_d0.m_at;
  local_cc[0] = true;
  local_cc[1] = false;
  local_cc[2] = false;
  local_cc[3] = false;
  doctest::detail::Expression_lhs<unsigned_long_const>::operator==
            (&local_c8,(Expression_lhs<unsigned_long_const> *)&local_30,(int *)local_cc);
  doctest::detail::ResultBuilder::setResult(&DOCTEST_RB,&local_c8);
  doctest::String::~String(&local_c8.m_decomp);
  doctest::detail::ResultBuilder::log(&DOCTEST_RB,__x);
  if (extraout_AL != '\0') {
    pcVar1 = (code *)swi(3);
    (*pcVar1)();
    return;
  }
  doctest::detail::ResultBuilder::react(&DOCTEST_RB);
  doctest::String::~String(&DOCTEST_RB.super_AssertData.m_decomp);
  doctest::String::~String(&DOCTEST_RB.super_AssertData.m_exception);
  doctest::detail::ResultBuilder::ResultBuilder
            (&DOCTEST_RB,DT_REQUIRE,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/igormironchik[P]cfgfile/tests/auto/QtGenerator/main.cpp"
             ,0x52,"cfg.vector().at( 0 ).string_field() == \"one\"","","");
  doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_d0,DT_REQUIRE);
  local_30.lhs = &std::vector<cfg::tags_t,_std::allocator<cfg::tags_t>_>::at(&cfg->m_vector,0)->
                  m_string_field;
  local_30.m_at = local_d0.m_at;
  doctest::detail::Expression_lhs<const_QString_&>::operator==<char[4],_nullptr>
            (&local_c8,&local_30,(char (*) [4])"one");
  doctest::detail::ResultBuilder::setResult(&DOCTEST_RB,&local_c8);
  doctest::String::~String(&local_c8.m_decomp);
  doctest::detail::ResultBuilder::log(&DOCTEST_RB,__x_00);
  if (extraout_AL_00 != '\0') {
    pcVar1 = (code *)swi(3);
    (*pcVar1)();
    return;
  }
  doctest::detail::ResultBuilder::react(&DOCTEST_RB);
  doctest::String::~String(&DOCTEST_RB.super_AssertData.m_decomp);
  doctest::String::~String(&DOCTEST_RB.super_AssertData.m_exception);
  doctest::detail::ResultBuilder::ResultBuilder
            (&DOCTEST_RB,DT_REQUIRE,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/igormironchik[P]cfgfile/tests/auto/QtGenerator/main.cpp"
             ,0x53,"cfg.vector().at( 0 ).no_value_field() == true","","");
  doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_d0,DT_REQUIRE);
  pvVar2 = std::vector<cfg::tags_t,_std::allocator<cfg::tags_t>_>::at(&cfg->m_vector,0);
  local_30.lhs = (QString *)((ulong)local_d0.m_at << 0x20 | (ulong)pvVar2->m_no_value_field);
  local_cc[0] = true;
  doctest::detail::Expression_lhs<bool_const>::operator==
            (&local_c8,(Expression_lhs<bool_const> *)&local_30,local_cc);
  doctest::detail::ResultBuilder::setResult(&DOCTEST_RB,&local_c8);
  doctest::String::~String(&local_c8.m_decomp);
  doctest::detail::ResultBuilder::log(&DOCTEST_RB,__x_01);
  if (extraout_AL_01 != '\0') {
    pcVar1 = (code *)swi(3);
    (*pcVar1)();
    return;
  }
  doctest::detail::ResultBuilder::react(&DOCTEST_RB);
  doctest::String::~String(&DOCTEST_RB.super_AssertData.m_decomp);
  doctest::String::~String(&DOCTEST_RB.super_AssertData.m_exception);
  doctest::detail::ResultBuilder::ResultBuilder
            (&DOCTEST_RB,DT_REQUIRE,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/igormironchik[P]cfgfile/tests/auto/QtGenerator/main.cpp"
             ,0x54,"cfg.vector().at( 0 ).int_field().size() == 2","","");
  doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_d0,DT_REQUIRE);
  pvVar2 = std::vector<cfg::tags_t,_std::allocator<cfg::tags_t>_>::at(&cfg->m_vector,0);
  local_30.lhs = (QString *)
                 ((long)(pvVar2->m_int_field).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)(pvVar2->m_int_field).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start >> 2);
  local_30.m_at = local_d0.m_at;
  local_cc[0] = true;
  local_cc[1] = false;
  local_cc[2] = false;
  local_cc[3] = false;
  doctest::detail::Expression_lhs<unsigned_long_const>::operator==
            (&local_c8,(Expression_lhs<unsigned_long_const> *)&local_30,(int *)local_cc);
  doctest::detail::ResultBuilder::setResult(&DOCTEST_RB,&local_c8);
  doctest::String::~String(&local_c8.m_decomp);
  doctest::detail::ResultBuilder::log(&DOCTEST_RB,__x_02);
  if (extraout_AL_02 != '\0') {
    pcVar1 = (code *)swi(3);
    (*pcVar1)();
    return;
  }
  doctest::detail::ResultBuilder::react(&DOCTEST_RB);
  doctest::String::~String(&DOCTEST_RB.super_AssertData.m_decomp);
  doctest::String::~String(&DOCTEST_RB.super_AssertData.m_exception);
  doctest::detail::ResultBuilder::ResultBuilder
            (&DOCTEST_RB,DT_REQUIRE,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/igormironchik[P]cfgfile/tests/auto/QtGenerator/main.cpp"
             ,0x55,"cfg.vector().at( 0 ).int_field().at( 0 ) == 100","","");
  doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_d0,DT_REQUIRE);
  pvVar2 = std::vector<cfg::tags_t,_std::allocator<cfg::tags_t>_>::at(&cfg->m_vector,0);
  local_30.lhs = (QString *)std::vector<int,_std::allocator<int>_>::at(&pvVar2->m_int_field,0);
  local_30.m_at = local_d0.m_at;
  local_cc[0] = true;
  local_cc[1] = false;
  local_cc[2] = false;
  local_cc[3] = false;
  doctest::detail::Expression_lhs<int_const&>::operator==
            (&local_c8,(Expression_lhs<int_const&> *)&local_30,(int *)local_cc);
  doctest::detail::ResultBuilder::setResult(&DOCTEST_RB,&local_c8);
  doctest::String::~String(&local_c8.m_decomp);
  doctest::detail::ResultBuilder::log(&DOCTEST_RB,__x_03);
  if (extraout_AL_03 != '\0') {
    pcVar1 = (code *)swi(3);
    (*pcVar1)();
    return;
  }
  doctest::detail::ResultBuilder::react(&DOCTEST_RB);
  doctest::String::~String(&DOCTEST_RB.super_AssertData.m_decomp);
  doctest::String::~String(&DOCTEST_RB.super_AssertData.m_exception);
  doctest::detail::ResultBuilder::ResultBuilder
            (&DOCTEST_RB,DT_REQUIRE,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/igormironchik[P]cfgfile/tests/auto/QtGenerator/main.cpp"
             ,0x56,"cfg.vector().at( 0 ).int_field().at( 1 ) == 200","","");
  doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_d0,DT_REQUIRE);
  pvVar2 = std::vector<cfg::tags_t,_std::allocator<cfg::tags_t>_>::at(&cfg->m_vector,0);
  local_30.lhs = (QString *)std::vector<int,_std::allocator<int>_>::at(&pvVar2->m_int_field,1);
  local_30.m_at = local_d0.m_at;
  local_cc[0] = true;
  local_cc[1] = false;
  local_cc[2] = false;
  local_cc[3] = false;
  doctest::detail::Expression_lhs<int_const&>::operator==
            (&local_c8,(Expression_lhs<int_const&> *)&local_30,(int *)local_cc);
  doctest::detail::ResultBuilder::setResult(&DOCTEST_RB,&local_c8);
  doctest::String::~String(&local_c8.m_decomp);
  doctest::detail::ResultBuilder::log(&DOCTEST_RB,__x_04);
  if (extraout_AL_04 != '\0') {
    pcVar1 = (code *)swi(3);
    (*pcVar1)();
    return;
  }
  doctest::detail::ResultBuilder::react(&DOCTEST_RB);
  doctest::String::~String(&DOCTEST_RB.super_AssertData.m_decomp);
  doctest::String::~String(&DOCTEST_RB.super_AssertData.m_exception);
  doctest::detail::ResultBuilder::ResultBuilder
            (&DOCTEST_RB,DT_REQUIRE,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/igormironchik[P]cfgfile/tests/auto/QtGenerator/main.cpp"
             ,0x57,"cfg.vector().at( 0 ).custom_field().m_value == 300","","");
  doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_d0,DT_REQUIRE);
  local_30.lhs = &std::vector<cfg::tags_t,_std::allocator<cfg::tags_t>_>::at(&cfg->m_vector,0)->
                  m_string_field;
  local_30.lhs = (QString *)&((const_reference)local_30.lhs)->m_custom_field;
  local_30.m_at = local_d0.m_at;
  local_cc[0] = true;
  local_cc[1] = true;
  local_cc[2] = false;
  local_cc[3] = false;
  doctest::detail::Expression_lhs<int_const&>::operator==
            (&local_c8,(Expression_lhs<int_const&> *)&local_30,(int *)local_cc);
  doctest::detail::ResultBuilder::setResult(&DOCTEST_RB,&local_c8);
  doctest::String::~String(&local_c8.m_decomp);
  doctest::detail::ResultBuilder::log(&DOCTEST_RB,__x_05);
  if (extraout_AL_05 != '\0') {
    pcVar1 = (code *)swi(3);
    (*pcVar1)();
    return;
  }
  doctest::detail::ResultBuilder::react(&DOCTEST_RB);
  doctest::String::~String(&DOCTEST_RB.super_AssertData.m_decomp);
  doctest::String::~String(&DOCTEST_RB.super_AssertData.m_exception);
  doctest::detail::ResultBuilder::ResultBuilder
            (&DOCTEST_RB,DT_REQUIRE,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/igormironchik[P]cfgfile/tests/auto/QtGenerator/main.cpp"
             ,0x59,"cfg.vector().at( 0 ).bool_scalar().bool_scalar() == true","","");
  doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_d0,DT_REQUIRE);
  local_30.lhs = &std::vector<cfg::tags_t,_std::allocator<cfg::tags_t>_>::at(&cfg->m_vector,0)->
                  m_string_field;
  local_30.lhs = (QString *)&((const_reference)local_30.lhs)->m_bool_scalar;
  local_30.m_at = local_d0.m_at;
  local_cc[0] = true;
  doctest::detail::Expression_lhs<bool_const&>::operator==
            (&local_c8,(Expression_lhs<bool_const&> *)&local_30,local_cc);
  doctest::detail::ResultBuilder::setResult(&DOCTEST_RB,&local_c8);
  doctest::String::~String(&local_c8.m_decomp);
  doctest::detail::ResultBuilder::log(&DOCTEST_RB,__x_06);
  if (extraout_AL_06 != '\0') {
    pcVar1 = (code *)swi(3);
    (*pcVar1)();
    return;
  }
  doctest::detail::ResultBuilder::react(&DOCTEST_RB);
  doctest::String::~String(&DOCTEST_RB.super_AssertData.m_decomp);
  doctest::String::~String(&DOCTEST_RB.super_AssertData.m_exception);
  doctest::detail::ResultBuilder::ResultBuilder
            (&DOCTEST_RB,DT_REQUIRE,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/igormironchik[P]cfgfile/tests/auto/QtGenerator/main.cpp"
             ,0x5a,"cfg.vector().at( 0 ).bool_scalar().string_field() == \"one\"","","");
  doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_d0,DT_REQUIRE);
  pvVar2 = std::vector<cfg::tags_t,_std::allocator<cfg::tags_t>_>::at(&cfg->m_vector,0);
  local_30.lhs = &(pvVar2->m_bool_scalar).m_string_field;
  local_30.m_at = local_d0.m_at;
  doctest::detail::Expression_lhs<const_QString_&>::operator==<char[4],_nullptr>
            (&local_c8,&local_30,(char (*) [4])"one");
  doctest::detail::ResultBuilder::setResult(&DOCTEST_RB,&local_c8);
  doctest::String::~String(&local_c8.m_decomp);
  doctest::detail::ResultBuilder::log(&DOCTEST_RB,__x_07);
  if (extraout_AL_07 != '\0') {
    pcVar1 = (code *)swi(3);
    (*pcVar1)();
    return;
  }
  doctest::detail::ResultBuilder::react(&DOCTEST_RB);
  doctest::String::~String(&DOCTEST_RB.super_AssertData.m_decomp);
  doctest::String::~String(&DOCTEST_RB.super_AssertData.m_exception);
  doctest::detail::ResultBuilder::ResultBuilder
            (&DOCTEST_RB,DT_REQUIRE,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/igormironchik[P]cfgfile/tests/auto/QtGenerator/main.cpp"
             ,0x5c,"cfg.vector().at( 0 ).int_scalar().int_scalar() == 100","","");
  doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_d0,DT_REQUIRE);
  local_30.lhs = &std::vector<cfg::tags_t,_std::allocator<cfg::tags_t>_>::at(&cfg->m_vector,0)->
                  m_string_field;
  local_30.lhs = (QString *)&((const_reference)local_30.lhs)->m_int_scalar;
  local_30.m_at = local_d0.m_at;
  local_cc[0] = true;
  local_cc[1] = false;
  local_cc[2] = false;
  local_cc[3] = false;
  doctest::detail::Expression_lhs<int_const&>::operator==
            (&local_c8,(Expression_lhs<int_const&> *)&local_30,(int *)local_cc);
  doctest::detail::ResultBuilder::setResult(&DOCTEST_RB,&local_c8);
  doctest::String::~String(&local_c8.m_decomp);
  doctest::detail::ResultBuilder::log(&DOCTEST_RB,__x_08);
  if (extraout_AL_08 != '\0') {
    pcVar1 = (code *)swi(3);
    (*pcVar1)();
    return;
  }
  doctest::detail::ResultBuilder::react(&DOCTEST_RB);
  doctest::String::~String(&DOCTEST_RB.super_AssertData.m_decomp);
  doctest::String::~String(&DOCTEST_RB.super_AssertData.m_exception);
  doctest::detail::ResultBuilder::ResultBuilder
            (&DOCTEST_RB,DT_REQUIRE,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/igormironchik[P]cfgfile/tests/auto/QtGenerator/main.cpp"
             ,0x5d,"cfg.vector().at( 0 ).int_scalar().string_field() == \"one\\n\\\"\\r\\t\\\\\"",""
             ,"");
  doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_d0,DT_REQUIRE);
  pvVar2 = std::vector<cfg::tags_t,_std::allocator<cfg::tags_t>_>::at(&cfg->m_vector,0);
  local_30.lhs = &(pvVar2->m_int_scalar).m_string_field;
  local_30.m_at = local_d0.m_at;
  doctest::detail::Expression_lhs<const_QString_&>::operator==<char[9],_nullptr>
            (&local_c8,&local_30,(char (*) [9])"one\n\"\r\t\\");
  doctest::detail::ResultBuilder::setResult(&DOCTEST_RB,&local_c8);
  doctest::String::~String(&local_c8.m_decomp);
  doctest::detail::ResultBuilder::log(&DOCTEST_RB,__x_09);
  if (extraout_AL_09 != '\0') {
    pcVar1 = (code *)swi(3);
    (*pcVar1)();
    return;
  }
  doctest::detail::ResultBuilder::react(&DOCTEST_RB);
  doctest::String::~String(&DOCTEST_RB.super_AssertData.m_decomp);
  doctest::String::~String(&DOCTEST_RB.super_AssertData.m_exception);
  doctest::detail::ResultBuilder::ResultBuilder
            (&DOCTEST_RB,DT_REQUIRE,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/igormironchik[P]cfgfile/tests/auto/QtGenerator/main.cpp"
             ,0x5f,"cfg.vector().at( 0 ).string_scalar().string_scalar() == \"string\"","","");
  doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_d0,DT_REQUIRE);
  local_30.lhs = &std::vector<cfg::tags_t,_std::allocator<cfg::tags_t>_>::at(&cfg->m_vector,0)->
                  m_string_field;
  local_30.lhs = &(((const_reference)local_30.lhs)->m_string_scalar).m_string_scalar;
  local_30.m_at = local_d0.m_at;
  doctest::detail::Expression_lhs<const_QString_&>::operator==<char[7],_nullptr>
            (&local_c8,&local_30,(char (*) [7])"string");
  doctest::detail::ResultBuilder::setResult(&DOCTEST_RB,&local_c8);
  doctest::String::~String(&local_c8.m_decomp);
  doctest::detail::ResultBuilder::log(&DOCTEST_RB,__x_10);
  if (extraout_AL_10 != '\0') {
    pcVar1 = (code *)swi(3);
    (*pcVar1)();
    return;
  }
  doctest::detail::ResultBuilder::react(&DOCTEST_RB);
  doctest::String::~String(&DOCTEST_RB.super_AssertData.m_decomp);
  doctest::String::~String(&DOCTEST_RB.super_AssertData.m_exception);
  doctest::detail::ResultBuilder::ResultBuilder
            (&DOCTEST_RB,DT_REQUIRE,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/igormironchik[P]cfgfile/tests/auto/QtGenerator/main.cpp"
             ,0x60,"cfg.vector().at( 0 ).string_scalar().string_field().isEmpty()","","");
  doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_d0,DT_REQUIRE);
  pvVar2 = std::vector<cfg::tags_t,_std::allocator<cfg::tags_t>_>::at(&cfg->m_vector,0);
  local_30.lhs = (QString *)
                 ((ulong)((pvVar2->m_string_scalar).m_string_field.d.size == 0) |
                 (ulong)local_d0.m_at << 0x20);
  doctest::detail::Expression_lhs::operator_cast_to_Result(&local_c8,(Expression_lhs *)&local_30);
  doctest::detail::ResultBuilder::setResult(&DOCTEST_RB,&local_c8);
  doctest::String::~String(&local_c8.m_decomp);
  doctest::detail::ResultBuilder::log(&DOCTEST_RB,__x_11);
  if (extraout_AL_11 != '\0') {
    pcVar1 = (code *)swi(3);
    (*pcVar1)();
    return;
  }
  doctest::detail::ResultBuilder::react(&DOCTEST_RB);
  doctest::String::~String(&DOCTEST_RB.super_AssertData.m_decomp);
  doctest::String::~String(&DOCTEST_RB.super_AssertData.m_exception);
  doctest::detail::ResultBuilder::ResultBuilder
            (&DOCTEST_RB,DT_REQUIRE,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/igormironchik[P]cfgfile/tests/auto/QtGenerator/main.cpp"
             ,0x62,"cfg.vector().at( 0 ).int_scalar_vector().int_scalar_vector().size() == 3","","")
  ;
  doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_d0,DT_REQUIRE);
  pvVar2 = std::vector<cfg::tags_t,_std::allocator<cfg::tags_t>_>::at(&cfg->m_vector,0);
  local_30.lhs = (QString *)
                 ((long)(pvVar2->m_int_scalar_vector).m_int_scalar_vector.
                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)(pvVar2->m_int_scalar_vector).m_int_scalar_vector.
                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start >> 2);
  local_30.m_at = local_d0.m_at;
  local_cc[0] = true;
  local_cc[1] = false;
  local_cc[2] = false;
  local_cc[3] = false;
  doctest::detail::Expression_lhs<unsigned_long_const>::operator==
            (&local_c8,(Expression_lhs<unsigned_long_const> *)&local_30,(int *)local_cc);
  doctest::detail::ResultBuilder::setResult(&DOCTEST_RB,&local_c8);
  doctest::String::~String(&local_c8.m_decomp);
  doctest::detail::ResultBuilder::log(&DOCTEST_RB,__x_12);
  if (extraout_AL_12 != '\0') {
    pcVar1 = (code *)swi(3);
    (*pcVar1)();
    return;
  }
  doctest::detail::ResultBuilder::react(&DOCTEST_RB);
  doctest::String::~String(&DOCTEST_RB.super_AssertData.m_decomp);
  doctest::String::~String(&DOCTEST_RB.super_AssertData.m_exception);
  doctest::detail::ResultBuilder::ResultBuilder
            (&DOCTEST_RB,DT_REQUIRE,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/igormironchik[P]cfgfile/tests/auto/QtGenerator/main.cpp"
             ,99,"cfg.vector().at( 0 ).int_scalar_vector().int_scalar_vector().at( 0 ) == 100","",""
            );
  doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_d0,DT_REQUIRE);
  pvVar2 = std::vector<cfg::tags_t,_std::allocator<cfg::tags_t>_>::at(&cfg->m_vector,0);
  local_30.lhs = (QString *)
                 std::vector<int,_std::allocator<int>_>::at
                           (&(pvVar2->m_int_scalar_vector).m_int_scalar_vector,0);
  local_30.m_at = local_d0.m_at;
  local_cc[0] = true;
  local_cc[1] = false;
  local_cc[2] = false;
  local_cc[3] = false;
  doctest::detail::Expression_lhs<int_const&>::operator==
            (&local_c8,(Expression_lhs<int_const&> *)&local_30,(int *)local_cc);
  doctest::detail::ResultBuilder::setResult(&DOCTEST_RB,&local_c8);
  doctest::String::~String(&local_c8.m_decomp);
  doctest::detail::ResultBuilder::log(&DOCTEST_RB,__x_13);
  if (extraout_AL_13 != '\0') {
    pcVar1 = (code *)swi(3);
    (*pcVar1)();
    return;
  }
  doctest::detail::ResultBuilder::react(&DOCTEST_RB);
  doctest::String::~String(&DOCTEST_RB.super_AssertData.m_decomp);
  doctest::String::~String(&DOCTEST_RB.super_AssertData.m_exception);
  doctest::detail::ResultBuilder::ResultBuilder
            (&DOCTEST_RB,DT_REQUIRE,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/igormironchik[P]cfgfile/tests/auto/QtGenerator/main.cpp"
             ,100,"cfg.vector().at( 0 ).int_scalar_vector().int_scalar_vector().at( 1 ) == 200","",
             "");
  doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_d0,DT_REQUIRE);
  pvVar2 = std::vector<cfg::tags_t,_std::allocator<cfg::tags_t>_>::at(&cfg->m_vector,0);
  local_30.lhs = (QString *)
                 std::vector<int,_std::allocator<int>_>::at
                           (&(pvVar2->m_int_scalar_vector).m_int_scalar_vector,1);
  local_30.m_at = local_d0.m_at;
  local_cc[0] = true;
  local_cc[1] = false;
  local_cc[2] = false;
  local_cc[3] = false;
  doctest::detail::Expression_lhs<int_const&>::operator==
            (&local_c8,(Expression_lhs<int_const&> *)&local_30,(int *)local_cc);
  doctest::detail::ResultBuilder::setResult(&DOCTEST_RB,&local_c8);
  doctest::String::~String(&local_c8.m_decomp);
  doctest::detail::ResultBuilder::log(&DOCTEST_RB,__x_14);
  if (extraout_AL_14 != '\0') {
    pcVar1 = (code *)swi(3);
    (*pcVar1)();
    return;
  }
  doctest::detail::ResultBuilder::react(&DOCTEST_RB);
  doctest::String::~String(&DOCTEST_RB.super_AssertData.m_decomp);
  doctest::String::~String(&DOCTEST_RB.super_AssertData.m_exception);
  doctest::detail::ResultBuilder::ResultBuilder
            (&DOCTEST_RB,DT_REQUIRE,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/igormironchik[P]cfgfile/tests/auto/QtGenerator/main.cpp"
             ,0x65,"cfg.vector().at( 0 ).int_scalar_vector().int_scalar_vector().at( 2 ) == 300","",
             "");
  doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_d0,DT_REQUIRE);
  pvVar2 = std::vector<cfg::tags_t,_std::allocator<cfg::tags_t>_>::at(&cfg->m_vector,0);
  local_30.lhs = (QString *)
                 std::vector<int,_std::allocator<int>_>::at
                           (&(pvVar2->m_int_scalar_vector).m_int_scalar_vector,2);
  local_30.m_at = local_d0.m_at;
  local_cc[0] = true;
  local_cc[1] = true;
  local_cc[2] = false;
  local_cc[3] = false;
  doctest::detail::Expression_lhs<int_const&>::operator==
            (&local_c8,(Expression_lhs<int_const&> *)&local_30,(int *)local_cc);
  doctest::detail::ResultBuilder::setResult(&DOCTEST_RB,&local_c8);
  doctest::String::~String(&local_c8.m_decomp);
  doctest::detail::ResultBuilder::log(&DOCTEST_RB,__x_15);
  if (extraout_AL_15 != '\0') {
    pcVar1 = (code *)swi(3);
    (*pcVar1)();
    return;
  }
  doctest::detail::ResultBuilder::react(&DOCTEST_RB);
  doctest::String::~String(&DOCTEST_RB.super_AssertData.m_decomp);
  doctest::String::~String(&DOCTEST_RB.super_AssertData.m_exception);
  doctest::detail::ResultBuilder::ResultBuilder
            (&DOCTEST_RB,DT_REQUIRE,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/igormironchik[P]cfgfile/tests/auto/QtGenerator/main.cpp"
             ,0x69,
             "cfg.vector().at( 0 ).int_scalar_vector().string_field() == \"StringStringStringStringStringStringStringString\" \"StringStringStringStringStringStringStringString\" \"StringStringStringString\""
             ,"","");
  doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_d0,DT_REQUIRE);
  pvVar2 = std::vector<cfg::tags_t,_std::allocator<cfg::tags_t>_>::at(&cfg->m_vector,0);
  local_30.lhs = &(pvVar2->m_int_scalar_vector).m_string_field;
  local_30.m_at = local_d0.m_at;
  doctest::detail::Expression_lhs<const_QString_&>::operator==<char[121],_nullptr>
            (&local_c8,&local_30,
             (char (*) [121])
             "StringStringStringStringStringStringStringStringStringStringStringStringStringStringStringStringStringStringStringString"
            );
  doctest::detail::ResultBuilder::setResult(&DOCTEST_RB,&local_c8);
  doctest::String::~String(&local_c8.m_decomp);
  doctest::detail::ResultBuilder::log(&DOCTEST_RB,__x_16);
  if (extraout_AL_16 != '\0') {
    pcVar1 = (code *)swi(3);
    (*pcVar1)();
    return;
  }
  doctest::detail::ResultBuilder::react(&DOCTEST_RB);
  doctest::String::~String(&DOCTEST_RB.super_AssertData.m_decomp);
  doctest::String::~String(&DOCTEST_RB.super_AssertData.m_exception);
  return;
}

Assistant:

void check_config( const cfg::vector_t & cfg )
{
	REQUIRE( cfg.vector().size() == 1 );
	REQUIRE( cfg.vector().at( 0 ).string_field() == "one" );
	REQUIRE( cfg.vector().at( 0 ).no_value_field() == true );
	REQUIRE( cfg.vector().at( 0 ).int_field().size() == 2 );
	REQUIRE( cfg.vector().at( 0 ).int_field().at( 0 ) == 100 );
	REQUIRE( cfg.vector().at( 0 ).int_field().at( 1 ) == 200 );
	REQUIRE( cfg.vector().at( 0 ).custom_field().m_value == 300 );

	REQUIRE( cfg.vector().at( 0 ).bool_scalar().bool_scalar() == true );
	REQUIRE( cfg.vector().at( 0 ).bool_scalar().string_field() == "one" );

	REQUIRE( cfg.vector().at( 0 ).int_scalar().int_scalar() == 100 );
	REQUIRE( cfg.vector().at( 0 ).int_scalar().string_field() == "one\n\"\r\t\\" );

	REQUIRE( cfg.vector().at( 0 ).string_scalar().string_scalar() == "string" );
	REQUIRE( cfg.vector().at( 0 ).string_scalar().string_field().isEmpty() );

	REQUIRE( cfg.vector().at( 0 ).int_scalar_vector().int_scalar_vector().size() == 3 );
	REQUIRE( cfg.vector().at( 0 ).int_scalar_vector().int_scalar_vector().at( 0 ) == 100 );
	REQUIRE( cfg.vector().at( 0 ).int_scalar_vector().int_scalar_vector().at( 1 ) == 200 );
	REQUIRE( cfg.vector().at( 0 ).int_scalar_vector().int_scalar_vector().at( 2 ) == 300 );
	REQUIRE( cfg.vector().at( 0 ).int_scalar_vector().string_field() ==
		"StringStringStringStringStringStringStringString"
		"StringStringStringStringStringStringStringString"
		"StringStringStringString" );
}